

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

void __thiscall CMU462::HalfedgeMesh::computeLinearSubdivisionPositions(HalfedgeMesh *this)

{
  bool bVar1;
  pointer pVVar2;
  pointer pEVar3;
  pointer pFVar4;
  FaceIter x_2;
  EdgeIter x_1;
  VertexIter x;
  HalfedgeMesh *in_stack_ffffffffffffff68;
  pointer in_stack_ffffffffffffff70;
  double local_78;
  double local_70;
  double local_68;
  _Self local_60;
  _Self local_58;
  _List_node_base *local_50;
  double local_48;
  double local_40;
  double local_38;
  _Self local_30;
  _Self local_28;
  _List_node_base *local_20;
  _Self local_18;
  _Self local_10 [2];
  
  local_10[0]._M_node = (_List_node_base *)verticesBegin(in_stack_ffffffffffffff68);
  while( true ) {
    local_18._M_node = (_List_node_base *)verticesEnd(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    in_stack_ffffffffffffff70 =
         std::_List_iterator<CMU462::Vertex>::operator->
                   ((_List_iterator<CMU462::Vertex> *)in_stack_ffffffffffffff70);
    pVVar2 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)in_stack_ffffffffffffff70);
    (pVVar2->newPosition).x = (in_stack_ffffffffffffff70->position).x;
    (pVVar2->newPosition).y = (in_stack_ffffffffffffff70->position).y;
    (pVVar2->newPosition).z = (in_stack_ffffffffffffff70->position).z;
    local_20 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(local_10,0);
  }
  local_28._M_node = (_List_node_base *)edgesBegin(in_stack_ffffffffffffff68);
  while( true ) {
    local_30._M_node = (_List_node_base *)edgesEnd(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    pEVar3 = std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)0x245f15)
    ;
    (**(pEVar3->super_HalfedgeElement)._vptr_HalfedgeElement)(&local_48);
    pEVar3 = std::_List_iterator<CMU462::Edge>::operator->((_List_iterator<CMU462::Edge> *)0x245f2c)
    ;
    (pEVar3->newPosition).x = local_48;
    (pEVar3->newPosition).y = local_40;
    (pEVar3->newPosition).z = local_38;
    local_50 = (_List_node_base *)std::_List_iterator<CMU462::Edge>::operator++(&local_28,0);
  }
  local_58._M_node = (_List_node_base *)facesBegin(in_stack_ffffffffffffff68);
  while( true ) {
    local_60._M_node = (_List_node_base *)facesEnd(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    pFVar4 = std::_List_iterator<CMU462::Face>::operator->
                       ((_List_iterator<CMU462::Face> *)in_stack_ffffffffffffff70);
    (**(pFVar4->super_HalfedgeElement)._vptr_HalfedgeElement)(&local_78);
    pFVar4 = std::_List_iterator<CMU462::Face>::operator->
                       ((_List_iterator<CMU462::Face> *)in_stack_ffffffffffffff70);
    (pFVar4->newPosition).x = local_78;
    (pFVar4->newPosition).y = local_70;
    (pFVar4->newPosition).z = local_68;
    std::_List_iterator<CMU462::Face>::operator++(&local_58,0);
  }
  return;
}

Assistant:

void HalfedgeMesh::computeLinearSubdivisionPositions() {
	// TODO For each vertex, assign Vertex::newPosition to
	// its original position, Vertex::position.
	for (VertexIter x = verticesBegin(); x != verticesEnd(); x++) {
		x->newPosition = x->position;
	}

	// TODO For each edge, assign the midpoint of the two original
	// positions to Edge::newPosition.
	for (EdgeIter x = edgesBegin(); x != edgesEnd(); x++) {
		x->newPosition = x->centroid();
	}

	// TODO For each face, assign the centroid (i.e., arithmetic mean)
	// of the original vertex positions to Face::newPosition.  Note
	// that in general, NOT all faces will be triangles!
	for (FaceIter x = facesBegin(); x != facesEnd(); x++) {
		x->newPosition = x->centroid();
	}

	//showError("computeLinearSubdivisionPositions() not implemented.");
}